

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

void __thiscall wabt::Var::Var(Var *this,Var *rhs)

{
  Location local_38;
  Var *local_18;
  Var *rhs_local;
  Var *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  Location::Location(&local_38);
  Var(this,0xffffffff,&local_38);
  operator=(this,local_18);
  return;
}

Assistant:

Var::Var(Var&& rhs) : Var(kInvalidIndex) {
  *this = std::move(rhs);
}